

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_version_manager.cpp
# Opt level: O2

bool __thiscall
duckdb::RowVersionManager::Fetch(RowVersionManager *this,TransactionData transaction,idx_t row)

{
  undefined1 uVar1;
  ChunkInfo *pCVar3;
  optional_ptr<duckdb::ChunkInfo,_true> local_20;
  int iVar2;
  
  ::std::mutex::lock(&this->version_lock);
  local_20 = GetChunkInfo(this,row >> 0xb);
  if (local_20.ptr == (ChunkInfo *)0x0) {
    uVar1 = 1;
  }
  else {
    pCVar3 = optional_ptr<duckdb::ChunkInfo,_true>::operator->(&local_20);
    iVar2 = (*pCVar3->_vptr_ChunkInfo[4])(pCVar3,(ulong)((uint)row & 0x7ff));
    uVar1 = (undefined1)iVar2;
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return (bool)uVar1;
}

Assistant:

bool RowVersionManager::Fetch(TransactionData transaction, idx_t row) {
	lock_guard<mutex> lock(version_lock);
	idx_t vector_index = row / STANDARD_VECTOR_SIZE;
	auto info = GetChunkInfo(vector_index);
	if (!info) {
		return true;
	}
	return info->Fetch(transaction, UnsafeNumericCast<row_t>(row - vector_index * STANDARD_VECTOR_SIZE));
}